

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::submitBufferWaitManySemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkResult VVar1;
  int iVar2;
  VkDevice device;
  DeviceInterface *vk;
  RefBase<vk::Handle<(vk::HandleType)6>_> *this;
  VkSubmitInfo *this_00;
  long lVar3;
  allocator<char> local_339;
  undefined1 local_338 [32];
  TestStatus *local_318;
  VkQueue local_310;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_308;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_2e8;
  RefBase<vk::VkCommandBuffer_s_*> local_2c8;
  VkSubmitInfo submitInfo2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> waitDstStageFlags;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_248;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkSemaphore semaphores [10];
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)4>_> semaphoreArray [10];
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_310 = Context::getUniversalQueue(context);
  cmdPoolParams.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)semaphoreArray,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  local_248.m_data.deleter.m_device =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
  local_248.m_data.deleter.m_allocator =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
  local_248.m_data.object.m_internal =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
  local_248.m_data.deleter.m_deviceIface =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)semaphoreArray);
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = local_248.m_data.object.m_internal;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)semaphoreArray,vk,device,&cmdBufParams);
  local_2c8.m_data.deleter.m_device =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
  local_2c8.m_data.deleter.m_pool.m_internal =
       (deUint64)
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
  local_2c8.m_data.object =
       (VkCommandBuffer_s *)
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
  local_2c8.m_data.deleter.m_deviceIface =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)semaphoreArray);
  primCmdBufBeginInfo.flags = 0;
  primCmdBufBeginInfo._20_4_ = 0;
  primCmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  primCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  primCmdBufBeginInfo._4_4_ = 0;
  primCmdBufBeginInfo.pNext = (void *)0x0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)semaphoreArray,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_308.m_data.deleter.m_device =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
  local_308.m_data.deleter.m_allocator =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
  local_308.m_data.object.m_internal =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
  local_308.m_data.deleter.m_deviceIface =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)semaphoreArray);
  VVar1 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,local_308.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6c);
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_2c8.m_data.object,&primCmdBufBeginInfo);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6f);
  (*vk->_vptr_DeviceInterface[0x6a])
            (vk,local_2c8.m_data.object,local_308.m_data.object.m_internal,0x10000);
  VVar1 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_2c8.m_data.object);
  ::vk::checkResult(VVar1,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd77);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)semaphoreArray,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  this = (RefBase<vk::Handle<(vk::HandleType)6>_> *)semaphoreArray;
  local_2e8.m_data.deleter.m_device =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
  local_2e8.m_data.deleter.m_allocator =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
  local_2e8.m_data.object.m_internal =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
  local_2e8.m_data.deleter.m_deviceIface =
       semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(this);
  memset(this,0,0x140);
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)local_338,vk,device,0,
               (VkAllocationCallbacks *)0x0);
    submitInfo2._16_8_ = local_338._16_8_;
    submitInfo2.pWaitSemaphores = (VkSemaphore *)local_338._24_8_;
    submitInfo2._0_8_ = local_338._0_8_;
    submitInfo2.pNext = (void *)local_338._8_8_;
    local_338._0_8_ = (pointer)0x0;
    local_338._8_8_ = (DeviceInterface *)0x0;
    local_338._16_8_ = (VkDevice)0x0;
    local_338._24_8_ = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)this);
    (((RefBase<vk::Handle<(vk::HandleType)4>_> *)this)->m_data).deleter.m_device =
         (VkDevice)submitInfo2._16_8_;
    (((RefBase<vk::Handle<(vk::HandleType)4>_> *)this)->m_data).deleter.m_allocator =
         (VkAllocationCallbacks *)submitInfo2.pWaitSemaphores;
    (((RefBase<vk::Handle<(vk::HandleType)4>_> *)this)->m_data).object.m_internal =
         submitInfo2._0_8_;
    (((RefBase<vk::Handle<(vk::HandleType)4>_> *)this)->m_data).deleter.m_deviceIface =
         (DeviceInterface *)submitInfo2.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_338);
    semaphores[lVar3].m_internal =
         (((RefBase<vk::Handle<(vk::HandleType)4>_> *)this)->m_data).object.m_internal;
    this = (RefBase<vk::Handle<(vk::HandleType)6>_> *)
           ((RefBase<vk::Handle<(vk::HandleType)4>_> *)this + 1);
  }
  submitInfo2.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo2.pNext = (void *)0x0;
  submitInfo2._16_8_ = submitInfo2._16_8_ & 0xffffffff00000000;
  submitInfo2.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo2.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo2.commandBufferCount = 1;
  submitInfo2.pCommandBuffers = (VkCommandBuffer *)&local_2c8;
  submitInfo2.signalSemaphoreCount = 10;
  submitInfo2.pSignalSemaphores = semaphores;
  VVar1 = (*vk->_vptr_DeviceInterface[2])
                    (vk,local_310,1,&submitInfo2,local_2e8.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo1, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd96);
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2e8,0,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd99);
  iVar2 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,local_308.m_data.object.m_internal);
  if (iVar2 == 3) {
    VVar1 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,local_308.m_data.object.m_internal);
    ::vk::checkResult(VVar1,"vk.resetEvent(vkDevice, *event)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda1);
    VVar1 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_2e8);
    ::vk::checkResult(VVar1,"vk.resetFences(vkDevice, 1u, &fence.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda4);
    submitInfo2.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    local_318 = __return_storage_ptr__;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&waitDstStageFlags,5,&submitInfo2.sType,(allocator_type *)local_338);
    for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 0x28) {
      submitInfo2.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
      submitInfo2.pNext = (void *)0x0;
      submitInfo2.waitSemaphoreCount = 5;
      submitInfo2.pWaitSemaphores = (VkSemaphore *)((long)&semaphores[0].m_internal + lVar3);
      submitInfo2.pWaitDstStageMask =
           waitDstStageFlags.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
      submitInfo2.commandBufferCount = 1;
      submitInfo2.pCommandBuffers = (VkCommandBuffer *)&local_2c8;
      submitInfo2.signalSemaphoreCount = 0;
      submitInfo2.pSignalSemaphores = (VkSemaphore *)0x0;
      VVar1 = (*vk->_vptr_DeviceInterface[2])
                        (vk,local_310,1,&submitInfo2,local_2e8.m_data.object.m_internal);
      ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo2, *fence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbc);
      VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2e8,0,1000000000);
      ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbf);
      iVar2 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,local_308.m_data.object.m_internal);
      if (iVar2 != 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_338,"Submit Buffer and Wait for Many Semaphores Test FAILED",
                   &local_339);
        __return_storage_ptr__ = local_318;
        tcu::TestStatus::fail(local_318,(string *)local_338);
        this_00 = (VkSubmitInfo *)local_338;
        goto LAB_004943f3;
      }
      VVar1 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_2e8);
      ::vk::checkResult(VVar1,"vk.resetFences(vkDevice, 1u, &fence.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdc8);
      VVar1 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,local_308.m_data.object.m_internal);
      ::vk::checkResult(VVar1,"vk.resetEvent(vkDevice, *event)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdcb);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&submitInfo2,"Submit Buffer and Wait for Many Semaphores Test succeeded",
               (allocator<char> *)local_338);
    __return_storage_ptr__ = local_318;
    tcu::TestStatus::pass(local_318,(string *)&submitInfo2);
    this_00 = &submitInfo2;
LAB_004943f3:
    std::__cxx11::string::~string((string *)this_00);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&waitDstStageFlags.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_338,"Submit Buffer and Wait for Many Semaphores Test FAILED",
               (allocator<char> *)&waitDstStageFlags);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_338);
    std::__cxx11::string::~string((string *)local_338);
  }
  lVar3 = 0x120;
  do {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)
               ((long)&semaphoreArray[0].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object
                       .m_internal + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_2e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_308);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_2c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_248);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus submitBufferWaitManySemaphores(Context& context)
{
	// This test will create numSemaphores semaphores, and signal them in NUM_SEMAPHORES submits to queue
	// After that the numSubmissions queue submissions will wait for each semaphore

	const deUint32							numSemaphores			= 10u;  // it must be multiply of numSubmission
	const deUint32							numSubmissions			= 2u;
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// VkCommandPoolCreateFlags		flags;
		queueFamilyIndex,											// deUint32						queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		*cmdPool,													// VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// VkCommandBufferLevel			level;
		1u,															// uint32_t						bufferCount;
	};

	// Create command buffer
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0,															// flags
		DE_NULL														// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	// create event that will be used to check if command buffers has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event - at creation state is undefined
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	// numSemaphores is declared const, so this array can be static
	// the semaphores will be destroyed automatically at end of scope
	Move <VkSemaphore>						semaphoreArray[numSemaphores];
	VkSemaphore								semaphores[numSemaphores];

	for (deUint32 idx = 0; idx < numSemaphores; ++idx) {
		// create semaphores for use in this test
		semaphoreArray[idx] = createSemaphore(vk, vkDevice);
		semaphores[idx] = semaphoreArray[idx].get();
	};

	{
		// create submit info for buffer - signal semaphores
		const VkSubmitInfo submitInfo1 =
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,							// sType
			DE_NULL,												// pNext
			0u,														// waitSemaphoreCount
			DE_NULL,												// pWaitSemaphores
			DE_NULL,												// pWaitDstStageMask
			1,														// commandBufferCount
			&primCmdBuf.get(),										// pCommandBuffers
			numSemaphores,											// signalSemaphoreCount
			semaphores												// pSignalSemaphores
		};
		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo1, *fence));

		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

		// check if buffer has been executed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));
	}

	const deUint32							numberOfSemaphoresToBeWaitedByOneSubmission	= numSemaphores / numSubmissions;
	const std::vector<VkPipelineStageFlags>	waitDstStageFlags							(numberOfSemaphoresToBeWaitedByOneSubmission, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);

	// the following code waits for the semaphores set above - numSubmissions queues will wait for each semaphore from above
	for (deUint32 idxSubmission = 0; idxSubmission < numSubmissions; ++idxSubmission) {

		// create submit info for buffer - waiting for semaphore
		const VkSubmitInfo				submitInfo2				=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,												// sType
			DE_NULL,																	// pNext
			numberOfSemaphoresToBeWaitedByOneSubmission,								// waitSemaphoreCount
			semaphores + (numberOfSemaphoresToBeWaitedByOneSubmission * idxSubmission),	// pWaitSemaphores
			waitDstStageFlags.data(),													// pWaitDstStageMask
			1,																			// commandBufferCount
			&primCmdBuf.get(),															// pCommandBuffers
			0u,																			// signalSemaphoreCount
			DE_NULL,																	// pSignalSemaphores
		};

		// Submit the second command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo2, *fence));

		// wait for 1 second.
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000));

		// check if second buffer has been executed
		// if it has been executed, it means that the semaphore was signalled - so test if passed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));
	}

	return tcu::TestStatus::pass("Submit Buffer and Wait for Many Semaphores Test succeeded");
}